

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

string * google::protobuf::internal::NameOfEnum_abi_cxx11_(EnumDescriptor *descriptor,int value)

{
  EnumValueDescriptor *pEVar1;
  string *psVar2;
  FunctionClosure0 local_20;
  
  pEVar1 = EnumDescriptor::FindValueByNumber(descriptor,value);
  if (pEVar1 == (EnumValueDescriptor *)0x0) {
    psVar2 = (string *)&fixed_address_empty_string_abi_cxx11_;
    if (empty_string_once_init_ != 2) {
      local_20.super_Closure._vptr_Closure = (_func_int **)&PTR__FunctionClosure0_0042b198;
      local_20.function_ = InitEmptyString;
      local_20.self_deleting_ = false;
      GoogleOnceInitImpl(&empty_string_once_init_,&local_20.super_Closure);
      FunctionClosure0::~FunctionClosure0(&local_20);
    }
  }
  else {
    psVar2 = *(string **)pEVar1;
  }
  return psVar2;
}

Assistant:

const string& NameOfEnum(const EnumDescriptor* descriptor, int value) {
  const EnumValueDescriptor* d = descriptor->FindValueByNumber(value);
  return (d == NULL ? GetEmptyString() : d->name());
}